

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.cpp
# Opt level: O0

vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
* __thiscall
spvtools::opt::analysis::ConstantManager::GetConstantsFromIds
          (vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
           *__return_storage_ptr__,ConstantManager *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *ids)

{
  pointer this_00;
  bool bVar1;
  reference puVar2;
  Constant *local_60;
  Constant *c;
  const_iterator cStack_50;
  uint32_t id;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  constants;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *ids_local;
  ConstantManager *this_local;
  
  constants.
  super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)ids;
  std::
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  ::vector((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
            *)&__range2);
  this_00 = constants.
            super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
  __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      constants.
                      super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cStack_50 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00);
  do {
    bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffb0);
    if (!bVar1) {
      std::
      vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
      ::vector(__return_storage_ptr__,
               (vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                *)&__range2);
LAB_0030797f:
      std::
      vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
      ::~vector((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                 *)&__range2);
      return __return_storage_ptr__;
    }
    puVar2 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end2);
    c._4_4_ = *puVar2;
    local_60 = FindDeclaredConstant(this,c._4_4_);
    if (local_60 == (Constant *)0x0) {
      memset(__return_storage_ptr__,0,0x18);
      std::
      vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
      ::vector(__return_storage_ptr__);
      goto LAB_0030797f;
    }
    std::
    vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
    ::push_back((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                 *)&__range2,&local_60);
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

std::vector<const Constant*> ConstantManager::GetConstantsFromIds(
    const std::vector<uint32_t>& ids) const {
  std::vector<const Constant*> constants;
  for (uint32_t id : ids) {
    if (const Constant* c = FindDeclaredConstant(id)) {
      constants.push_back(c);
    } else {
      return {};
    }
  }
  return constants;
}